

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString(String *__return_storage_ptr__,float in)

{
  _Alloc_hider __src;
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  size_type sVar4;
  string d;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  anon_union_24_2_13149d16_for_String_2 local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  anon_union_24_2_13149d16_for_String_2 local_190;
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.data);
  *(undefined8 *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18) + -0x10) = 5;
  *(uint *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>((double)in);
  std::__cxx11::stringbuf::str();
  if (local_1e8._M_string_length != 0) {
    lVar3 = 0;
    do {
      if (local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1] != '0') {
        if (lVar3 != 0) {
          sVar4 = local_1e8._M_string_length - 1;
          if (local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1] == '.') {
            sVar4 = local_1e8._M_string_length;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_1b0,&local_1e8,0,sVar4 + 1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_1e8,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        break;
      }
      local_1e8._M_string_length = local_1e8._M_string_length - 1;
      lVar3 = lVar3 + 1;
    } while (local_1e8._M_string_length != 0);
  }
  __src._M_p = local_1e8._M_dataplus._M_p;
  sVar1 = strlen(local_1e8._M_dataplus._M_p);
  pcVar2 = String::allocate((String *)&local_1c8.data,(uint)sVar1);
  memcpy(pcVar2,__src._M_p,sVar1 & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.data);
  std::ios_base::~ios_base(local_120);
  pcVar2 = String::allocate((String *)&local_190.data,1);
  *pcVar2 = 'f';
  operator+(__return_storage_ptr__,(String *)&local_1c8.data,(String *)&local_190.data);
  if ((local_190.buf[0x17] < '\0') && (local_190.data.ptr != (char *)0x0)) {
    operator_delete__(local_190.data.ptr);
  }
  if ((local_1c8.buf[0x17] < '\0') && (local_1c8.data.ptr != (char *)0x0)) {
    operator_delete__(local_1c8.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }